

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

void __thiscall BackwardPass::DoSetDead(BackwardPass *this,Opnd *opnd,bool isDead)

{
  if (this->tag == BackwardPhase && isDead) {
    if (this->currentPrePassLoop == (Loop *)0x0) {
      opnd->field_0xb = opnd->field_0xb | 4;
    }
  }
  else if (this->tag == DeadStorePhase) {
    opnd->field_0xb = opnd->field_0xb & 0xfb | isDead << 2;
  }
  return;
}

Assistant:

void
BackwardPass::DoSetDead(IR::Opnd * opnd, bool isDead) const
{
    // Note: Dead bit on the Opnd records flow-based liveness.
    // This is distinct from isLastUse, which records lexical last-ness.
    if (isDead && this->tag == Js::BackwardPhase && !this->IsPrePass())
    {
        opnd->SetIsDead();
    }
    else if (this->tag == Js::DeadStorePhase)
    {
        // Set or reset in DeadStorePhase.
        // CSE could make previous dead operand not the last use, so reset it.
        opnd->SetIsDead(isDead);
    }
}